

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lz4hc.c
# Opt level: O1

int LZ4_compress_HC_destSize
              (void *state,char *source,char *dest,int *sourceSizePtr,int targetDestSize,int cLevel)

{
  LZ4_u32 LVar1;
  int iVar2;
  short sVar3;
  ulong uVar4;
  LZ4_streamHC_t *LZ4_streamHCPtr;
  
  if (((ulong)state & 7) == 0 && state != (void *)0x0) {
    memset(state,0,0x40030);
    *(undefined2 *)((long)state + 0x40024) = 9;
  }
  else {
    state = (LZ4HC_CCtx_internal *)0x0;
  }
  if ((LZ4HC_CCtx_internal *)state == (LZ4HC_CCtx_internal *)0x0) {
    iVar2 = 0;
  }
  else {
    uVar4 = (long)((LZ4HC_CCtx_internal *)state)->end - (long)((LZ4HC_CCtx_internal *)state)->base;
    if (0x40000000 < uVar4) {
      uVar4 = 0;
      memset(state,0,0x20000);
      memset(((LZ4HC_CCtx_internal *)state)->chainTable,0xff,0x20000);
    }
    LVar1 = (int)uVar4 + 0x10000;
    ((LZ4HC_CCtx_internal *)state)->nextToUpdate = LVar1;
    ((LZ4HC_CCtx_internal *)state)->base = (LZ4_byte *)(source + (-0x10000 - uVar4));
    ((LZ4HC_CCtx_internal *)state)->end = (LZ4_byte *)source;
    ((LZ4HC_CCtx_internal *)state)->dictBase = (LZ4_byte *)(source + (-0x10000 - uVar4));
    ((LZ4HC_CCtx_internal *)state)->dictLimit = LVar1;
    ((LZ4HC_CCtx_internal *)state)->lowLimit = LVar1;
    iVar2 = 0xc;
    if ((uint)cLevel < 0xc) {
      iVar2 = cLevel;
    }
    sVar3 = 9;
    if (0 < cLevel) {
      sVar3 = (short)iVar2;
    }
    ((LZ4HC_CCtx_internal *)state)->compressionLevel = sVar3;
    iVar2 = LZ4HC_compress_generic
                      ((LZ4HC_CCtx_internal *)state,source,dest,sourceSizePtr,targetDestSize,cLevel,
                       fillOutput);
  }
  return iVar2;
}

Assistant:

int LZ4_compress_HC_destSize(void* state, const char* source, char* dest, int* sourceSizePtr, int targetDestSize, int cLevel)
{
    LZ4_streamHC_t* const ctx = LZ4_initStreamHC(state, sizeof(*ctx));
    if (ctx==NULL) return 0;   /* init failure */
    LZ4HC_init_internal(&ctx->internal_donotuse, (const BYTE*) source);
    LZ4_setCompressionLevel(ctx, cLevel);
    return LZ4HC_compress_generic(&ctx->internal_donotuse, source, dest, sourceSizePtr, targetDestSize, cLevel, fillOutput);
}